

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_inter.c
# Opt level: O0

void sys_unlock(void)

{
  pthread_mutex_unlock((pthread_mutex_t *)&sys_mutex);
  return;
}

Assistant:

void sys_unlock(void)
{
#ifdef PDINSTANCE
    pd_this->pd_islocked = 0;
    pthread_rwlock_unlock(&sys_rwlock);
    pthread_mutex_unlock(&INTER->i_mutex);
#else
    pthread_mutex_unlock(&sys_mutex);
#endif
}